

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

void __thiscall
QPDF::JSONReactor::JSONReactor
          (JSONReactor *this,QPDF *pdf,shared_ptr<InputSource> *is,bool must_be_complete)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_68;
  JSON_Descr local_48;
  
  (this->super_Reactor)._vptr_Reactor = (_func_int **)&PTR__JSONReactor_002eea60;
  this->pdf = pdf;
  peVar5 = (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  p_Var4 = (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
      peVar5 = (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  this->must_be_complete = must_be_complete;
  iVar3 = (*peVar5->_vptr_InputSource[3])();
  local_78.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string_const&>
            (&local_78.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_78,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var,iVar3));
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  QPDFObject::JSON_Descr::JSON_Descr(&local_48,&local_78,&local_68);
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  _Var2._M_pi = local_48.input.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002edbd8;
  paVar1 = &local_48.object.field_2;
  local_48.input.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4[1]._vptr__Sp_counted_base =
       (_func_int **)
       local_48.input.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var4[1]._M_use_count = _Var2._M_pi;
  local_48.input.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  p_Var4[2]._vptr__Sp_counted_base = (_func_int **)(p_Var4 + 3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.object._M_dataplus._M_p == paVar1) {
    p_Var4[3]._vptr__Sp_counted_base =
         (_func_int **)
         CONCAT71(local_48.object.field_2._M_allocated_capacity._1_7_,
                  local_48.object.field_2._M_local_buf[0]);
    p_Var4[3]._M_use_count = local_48.object.field_2._8_4_;
    p_Var4[3]._M_weak_count = local_48.object.field_2._12_4_;
  }
  else {
    p_Var4[2]._vptr__Sp_counted_base = (_func_int **)local_48.object._M_dataplus._M_p;
    p_Var4[3]._vptr__Sp_counted_base =
         (_func_int **)
         CONCAT71(local_48.object.field_2._M_allocated_capacity._1_7_,
                  local_48.object.field_2._M_local_buf[0]);
  }
  p_Var4[2]._M_use_count = (undefined4)local_48.object._M_string_length;
  p_Var4[2]._M_weak_count = local_48.object._M_string_length._4_4_;
  local_48.object._M_string_length = 0;
  local_48.object.field_2._M_local_buf[0] = '\0';
  *(undefined1 *)&p_Var4[4]._M_use_count = 1;
  (this->descr).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  (this->descr).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var4 + 1);
  local_48.object._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_78.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  this->saw_objects = false;
  this->saw_json_version = false;
  this->saw_pdf_version = false;
  this->saw_trailer = false;
  this->errors = false;
  this->saw_qpdf = false;
  this->saw_qpdf_meta = false;
  this->saw_objects = false;
  (this->cur_object)._M_dataplus._M_p = (pointer)&(this->cur_object).field_2;
  (this->cur_object)._M_string_length = 0;
  (this->cur_object).field_2._M_local_buf[0] = '\0';
  this->saw_value = false;
  this->saw_stream = false;
  this->saw_dict = false;
  this->saw_data = false;
  this->saw_datafile = false;
  this->this_stream_needs_data = false;
  (this->stack).
  super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).
  super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).
  super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_obj).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  *(undefined8 *)
   ((long)&(this->next_obj).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = 0;
  *(undefined8 *)
   ((long)&(this->next_obj).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) = 0;
  return;
}

Assistant:

JSONReactor(QPDF& pdf, std::shared_ptr<InputSource> is, bool must_be_complete) :
        pdf(pdf),
        is(is),
        must_be_complete(must_be_complete),
        descr(
            std::make_shared<QPDFObject::Description>(
                QPDFObject::JSON_Descr(std::make_shared<std::string>(is->getName()), "")))
    {
    }